

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  u8 *puVar1;
  RtreeConstraint *pCons;
  RtreeSearchPoint *pRVar2;
  double dVar3;
  RtreeSearchPoint *pNew;
  RtreeConstraint *p_1;
  i64 iNode;
  i64 iRowid;
  RtreeSearchPoint *p;
  RtreeNode *pLeaf;
  sqlite3_stmt *pStmt;
  int local_58;
  int iCell;
  int rc;
  int ii;
  RtreeNode *pRoot;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  sqlite3_value **argv_local;
  char *pcStack_28;
  int argc_local;
  char *idxStr_local;
  sqlite3_vtab_cursor *psStack_18;
  int idxNum_local;
  sqlite3_vtab_cursor *pVtabCursor_local;
  
  pCsr = (RtreeCursor *)pVtabCursor->pVtab;
  _rc = (RtreeNode *)0x0;
  local_58 = 0;
  pStmt._4_4_ = 0;
  pRoot = (RtreeNode *)pVtabCursor;
  pRtree = (Rtree *)argv;
  argv_local._4_4_ = argc;
  pcStack_28 = idxStr;
  idxStr_local._4_4_ = idxNum;
  psStack_18 = pVtabCursor;
  rtreeReference((Rtree *)pCsr);
  freeCursorConstraints((RtreeCursor *)pRoot);
  sqlite3_free((void *)pRoot[1].iNode);
  pLeaf = *(RtreeNode **)&pRoot[1].nRef;
  memset(pRoot,0,0x128);
  pRoot->pParent = (RtreeNode *)pCsr;
  *(RtreeNode **)&pRoot[1].nRef = pLeaf;
  *(int *)((long)&pRoot->iNode + 4) = idxStr_local._4_4_;
  if (idxStr_local._4_4_ == 1) {
    iNode = sqlite3_value_int64((sqlite3_value *)(pRtree->base).pModule);
    p_1 = (RtreeConstraint *)0x0;
    local_58 = findLeafNode((Rtree *)pCsr,iNode,(RtreeNode **)&p,(sqlite3_int64 *)&p_1);
    if ((local_58 == 0) && (p != (RtreeSearchPoint *)0x0)) {
      iRowid = (i64)rtreeSearchPointNew((RtreeCursor *)pRoot,0.0,'\0');
      pRoot[2].iNode = (i64)p;
      ((RtreeSearchPoint *)iRowid)->id = (sqlite3_int64)p_1;
      ((RtreeSearchPoint *)iRowid)->eWithin = '\x01';
      local_58 = nodeRowidIndex((Rtree *)pCsr,(RtreeNode *)p,iNode,(int *)((long)&pStmt + 4));
      *(char *)(iRowid + 0x12) = (char)pStmt._4_4_;
    }
    else {
      *(undefined1 *)&pRoot->iNode = 1;
    }
  }
  else {
    local_58 = nodeAcquire((Rtree *)pCsr,1,(RtreeNode *)0x0,(RtreeNode **)&rc);
    if ((local_58 == 0) && (0 < argv_local._4_4_)) {
      puVar1 = (u8 *)sqlite3_malloc64((long)argv_local._4_4_ * 0x18);
      pRoot->zData = puVar1;
      pRoot->nRef = argv_local._4_4_;
      if (pRoot->zData == (u8 *)0x0) {
        local_58 = 7;
      }
      else {
        memset(pRoot->zData,0,(long)argv_local._4_4_ * 0x18);
        memset(&pRoot[3].iNode,0,(long)(*(int *)&pCsr->field_0x2c + 1) << 2);
        for (iCell = 0; iCell < argv_local._4_4_; iCell = iCell + 1) {
          pCons = (RtreeConstraint *)(pRoot->zData + (long)iCell * 0x18);
          pCons->op = (int)pcStack_28[iCell << 1];
          pCons->iCoord = pcStack_28[iCell * 2 + 1] + -0x30;
          if (pCons->op < 0x46) {
            dVar3 = sqlite3_value_double((sqlite3_value *)(&(pRtree->base).pModule)[iCell]);
            (pCons->u).rValue = dVar3;
          }
          else {
            local_58 = deserializeGeometry((sqlite3_value *)(&(pRtree->base).pModule)[iCell],pCons);
            if (local_58 != 0) break;
            pCons->pInfo->nCoord = (uint)*(byte *)((long)&pCsr->nPoint + 1);
            pCons->pInfo->anQueue = (uint *)&pRoot[3].iNode;
            pCons->pInfo->mxLevel = *(int *)&pCsr->field_0x2c + 1;
          }
        }
      }
    }
    if (local_58 == 0) {
      pRVar2 = rtreeSearchPointNew((RtreeCursor *)pRoot,0.0,
                                   (char)*(undefined4 *)&pCsr->field_0x2c + '\x01');
      if (pRVar2 == (RtreeSearchPoint *)0x0) {
        return 7;
      }
      pRVar2->id = 1;
      pRVar2->iCell = '\0';
      pRVar2->eWithin = '\x01';
      pRoot[2].iNode = (i64)_rc;
      _rc = (RtreeNode *)0x0;
      local_58 = rtreeStepToLeaf((RtreeCursor *)pRoot);
    }
  }
  nodeRelease((Rtree *)pCsr,_rc);
  rtreeRelease((Rtree *)pCsr);
  return local_58;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;
  sqlite3_stmt *pStmt;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  freeCursorConstraints(pCsr);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array 
    ** with the configured constraints. 
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else{
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}